

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O2

int heap_add_entry(archive_read *a,heap_queue *heap,file_info *file,uint64_t key)

{
  file_info **__src;
  uint uVar1;
  int iVar2;
  file_info **ppfVar3;
  uint uVar4;
  int iVar5;
  
  uVar1 = heap->used;
  iVar2 = heap->allocated;
  if ((int)uVar1 < iVar2) {
LAB_00327ebb:
    file->key = key;
    heap->used = uVar1 + 1;
    while (0 < (int)uVar1) {
      uVar4 = uVar1 - 1 >> 1;
      ppfVar3 = heap->files;
      if (ppfVar3[uVar4]->key <= key) {
        ppfVar3[uVar1] = file;
        goto LAB_00327f0b;
      }
      ppfVar3[uVar1] = ppfVar3[uVar4];
      uVar1 = uVar4;
    }
    *heap->files = file;
LAB_00327f0b:
    iVar2 = 0;
  }
  else {
    iVar5 = iVar2 * 2;
    if (iVar2 < 0x400) {
      iVar5 = 0x400;
    }
    if (iVar2 < iVar5) {
      ppfVar3 = (file_info **)malloc((long)iVar5 << 3);
      if (ppfVar3 != (file_info **)0x0) {
        __src = heap->files;
        if (iVar2 != 0) {
          memcpy(ppfVar3,__src,(long)iVar2 << 3);
        }
        free(__src);
        heap->files = ppfVar3;
        heap->allocated = iVar5;
        uVar1 = heap->used;
        goto LAB_00327ebb;
      }
    }
    archive_set_error(&a->archive,0xc,"Out of memory");
    iVar2 = -0x1e;
  }
  return iVar2;
}

Assistant:

static int
heap_add_entry(struct archive_read *a, struct heap_queue *heap,
    struct file_info *file, uint64_t key)
{
	uint64_t file_key, parent_key;
	int hole, parent;

	/* Expand our pending files list as necessary. */
	if (heap->used >= heap->allocated) {
		struct file_info **new_pending_files;
		int new_size = heap->allocated * 2;

		if (heap->allocated < 1024)
			new_size = 1024;
		/* Overflow might keep us from growing the list. */
		if (new_size <= heap->allocated) {
			archive_set_error(&a->archive,
			    ENOMEM, "Out of memory");
			return (ARCHIVE_FATAL);
		}
		new_pending_files = (struct file_info **)
		    malloc(new_size * sizeof(new_pending_files[0]));
		if (new_pending_files == NULL) {
			archive_set_error(&a->archive,
			    ENOMEM, "Out of memory");
			return (ARCHIVE_FATAL);
		}
		if (heap->allocated)
			memcpy(new_pending_files, heap->files,
			    heap->allocated * sizeof(new_pending_files[0]));
		if (heap->files != NULL)
			free(heap->files);
		heap->files = new_pending_files;
		heap->allocated = new_size;
	}

	file_key = file->key = key;

	/*
	 * Start with hole at end, walk it up tree to find insertion point.
	 */
	hole = heap->used++;
	while (hole > 0) {
		parent = (hole - 1)/2;
		parent_key = heap->files[parent]->key;
		if (file_key >= parent_key) {
			heap->files[hole] = file;
			return (ARCHIVE_OK);
		}
		/* Move parent into hole <==> move hole up tree. */
		heap->files[hole] = heap->files[parent];
		hole = parent;
	}
	heap->files[0] = file;

	return (ARCHIVE_OK);
}